

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

uint32_t __thiscall
slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true>::
insertFrom(LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true> *this,uint32_t i,
          uint32_t size,interval<unsigned_long> *key,Expression **value)

{
  interval<unsigned_long> *piVar1;
  unsigned_long uVar2;
  uint32_t uVar3;
  
  uVar3 = 6;
  if (i != 5) {
    if (size - i != 0) {
      if (size == 5) {
        return 6;
      }
      NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      ::moveRight(&this->
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
                  ,i,i + 1,size - i);
    }
    uVar2 = key->right;
    piVar1 = (this->
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
             ).first + i;
    piVar1->left = key->left;
    piVar1->right = uVar2;
    (this->
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
    ).second[i] = *value;
    uVar3 = size + 1;
  }
  return uVar3;
}

Assistant:

uint32_t LeafNode<TKey, TValue, Capacity, _IsRoot>::insertFrom(uint32_t i, uint32_t size,
                                                               const interval<TKey>& key,
                                                               const TValue& value) {
    SLANG_ASSERT(i <= size && size <= Capacity);
    SLANG_ASSERT(key.left <= key.right);
    SLANG_ASSERT(i == 0 || keyAt(i - 1).left < key.left);
    SLANG_ASSERT(i == size || !(keyAt(i).left < key.left));

    // If we're at capacity we can't insert another element.
    if (i == Capacity)
        return Capacity + 1;

    if (i != size) {
        // We're inserting in the middle -- make sure we have room.
        if (size == Capacity)
            return Capacity + 1;

        this->moveRight(i, i + 1, size - i);
    }

    this->first[i] = key;
    this->second[i] = value;
    return size + 1;
}